

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlPatternMaxDepth(xmlPatternPtr comp)

{
  int local_20;
  int local_1c;
  int i;
  int ret;
  xmlPatternPtr comp_local;
  
  local_1c = 0;
  _i = comp;
  if (comp == (xmlPatternPtr)0x0) {
    comp_local._4_4_ = -1;
  }
  else {
    for (; _i != (xmlPatternPtr)0x0; _i = _i->next) {
      if (_i->stream == (xmlStreamCompPtr)0x0) {
        return -1;
      }
      for (local_20 = 0; local_20 < _i->stream->nbStep; local_20 = local_20 + 1) {
        if ((_i->stream->steps[local_20].flags & 1U) != 0) {
          return -2;
        }
      }
      if (local_1c < _i->stream->nbStep) {
        local_1c = _i->stream->nbStep;
      }
    }
    comp_local._4_4_ = local_1c;
  }
  return comp_local._4_4_;
}

Assistant:

int
xmlPatternMaxDepth(xmlPatternPtr comp) {
    int ret = 0, i;
    if (comp == NULL)
        return(-1);
    while (comp != NULL) {
        if (comp->stream == NULL)
	    return(-1);
	for (i = 0;i < comp->stream->nbStep;i++)
	    if (comp->stream->steps[i].flags & XML_STREAM_STEP_DESC)
	        return(-2);
	if (comp->stream->nbStep > ret)
	    ret = comp->stream->nbStep;
	comp = comp->next;
    }
    return(ret);
}